

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pTVar1;
  Base<google::protobuf::FieldOptions> *pBVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  Rep *pRVar8;
  void **ppvVar9;
  undefined8 *puVar10;
  int iVar11;
  ulong uVar12;
  int array_size;
  int iVar13;
  long lVar14;
  void **ppvVar15;
  int iVar16;
  protobuf local_40 [16];
  
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
LAB_0022c4fc:
    PlanAllocationSize(local_40);
LAB_0022c506:
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x3b89);
  }
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value +
       (fields->super_RepeatedPtrFieldBase).current_size_ * 0x58;
  ppvVar15 = (void **)fields;
  if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
    ppvVar15 = pRVar8->elements;
  }
  ppvVar9 = (void **)fields;
  if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
    ppvVar9 = pRVar8->elements;
  }
  iVar3 = (fields->super_RepeatedPtrFieldBase).current_size_;
  if (ppvVar15 != ppvVar9 + iVar3) {
    iVar16 = 0x11;
    if (parent_scope_size != 0) {
      iVar16 = (int)parent_scope_size + 0x12;
    }
    do {
      pvVar4 = *ppvVar15;
      if (((*(uint *)((long)pvVar4 + 0x10) & 0x20) != 0) && (*(long *)((long)pvVar4 + 0x40) == 0))
      goto LAB_0022c506;
      if ((*(uint *)((long)pvVar4 + 0x10) & 0x20) != 0) {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
          pBVar2 = &(alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).total_.payload_.super_Base<google::protobuf::FieldOptions>;
          pBVar2->value = pBVar2->value + 1;
          goto LAB_0022c36b;
        }
LAB_0022c4f2:
        PlanAllocationSize(local_40);
        goto LAB_0022c4fc;
      }
LAB_0022c36b:
      puVar10 = (undefined8 *)(*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffffc);
      pcVar5 = (char *)*puVar10;
      lVar6 = puVar10[1];
      if ((*(byte *)((long)pvVar4 + 0x10) & 0x10) == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *(ulong *)((long)pvVar4 + 0x38) & 0xfffffffffffffffc;
      }
      if ((alloc->
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
        PlanAllocationSize(local_40);
        goto LAB_0022c4f2;
      }
      iVar7 = (int)lVar6;
      array_size = iVar16 + iVar7;
      if (uVar12 == 0) {
        if ((lVar6 == 0) || (iVar13 = 2, (byte)(*pcVar5 + 0x9fU) < 0x1a)) {
          if (lVar6 == 0) {
            iVar13 = 0;
          }
          else {
            lVar14 = 0;
            iVar13 = 0;
            do {
              if ((byte)(pcVar5[lVar14] + 0xbfU) < 0x1a) {
                iVar13 = 2;
                break;
              }
              if (pcVar5[lVar14] == '_') {
                iVar13 = 1;
              }
              lVar14 = lVar14 + 1;
            } while (lVar6 != lVar14);
          }
        }
        if (iVar13 == 1) {
          if (lVar6 == 0) {
            iVar13 = 0;
          }
          else {
            lVar14 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)(pcVar5[lVar14] == '_');
              lVar14 = lVar14 + 1;
            } while (lVar6 != lVar14);
          }
          array_size = ((array_size + iVar7) - iVar13) + 1;
        }
        else if (iVar13 != 0) goto LAB_0022c3a0;
      }
      else {
LAB_0022c3a0:
        if (lVar6 == 0) {
          iVar13 = 0;
        }
        else {
          lVar14 = 0;
          iVar13 = 0;
          do {
            iVar13 = iVar13 + (uint)(pcVar5[lVar14] == '_');
            lVar14 = lVar14 + 1;
          } while (lVar6 != lVar14);
        }
        if (uVar12 == 0) {
          if (lVar6 == 0) {
            iVar11 = 0;
          }
          else {
            lVar14 = 0;
            iVar11 = 0;
            do {
              iVar11 = iVar11 + (uint)(pcVar5[lVar14] == '_');
              lVar14 = lVar14 + 1;
            } while (lVar6 != lVar14);
          }
          iVar11 = iVar7 - iVar11;
        }
        else {
          iVar11 = (int)*(undefined8 *)(uVar12 + 8);
        }
        array_size = ((array_size + iVar7 * 2) - iVar13) + iVar11 + 3;
      }
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<char>(&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,array_size);
      if (((~*(uint *)((long)pvVar4 + 0x10) & 0x408) == 0) &&
         ((*(int *)((long)pvVar4 + 0x58) == 0xc || (*(int *)((long)pvVar4 + 0x58) == 9)))) {
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,1);
      }
      ppvVar15 = ppvVar15 + 1;
    } while (ppvVar15 != ppvVar9 + iVar3);
  }
  return;
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }